

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConsequenceFinder.cpp
# Opt level: O2

void __thiscall Saturation::ConsequenceFinder::onClauseRemoved(ConsequenceFinder *this,Clause *cl)

{
  uint indexNum;
  bool *pbVar1;
  Literal **ppLVar2;
  uint uVar3;
  uint uVar4;
  
  uVar4 = *(uint *)&cl->field_0x38 & 0xfffff;
  uVar3 = (uint)(uVar4 != 0);
  ppLVar2 = (Literal **)0x0;
  if (uVar4 != 0) {
    ppLVar2 = cl->_literals;
  }
  while (ppLVar2 != (Literal **)0x0) {
    indexNum = ((*ppLVar2)->super_Term)._functor;
    if (((*(byte *)(*(long *)(*(long *)(DAT_00a14190 + 0x80) + (ulong)indexNum * 8) + 0x40) & 0x20)
         != 0) &&
       (pbVar1 = Lib::Array<bool>::operator[](&(this->_redundant).super_Array<bool>,(ulong)indexNum)
       , *pbVar1 == false)) {
      indexClause(this,indexNum,cl,false);
    }
    ppLVar2 = cl->_literals + (int)uVar3;
    if (uVar4 <= uVar3) {
      ppLVar2 = (Literal **)0x0;
    }
    uVar3 = uVar3 + (uVar3 < uVar4);
  }
  return;
}

Assistant:

void ConsequenceFinder::onClauseRemoved(Clause* cl)
{
  TIME_TRACE(TimeTrace::CONSEQUENCE_FINDING);

  for (auto l : cl->iterLits()) {
    unsigned fn = l->functor();
    if(!env.signature->getPredicate(fn)->label()) {
      continue;
    }
    if(!_redundant[fn]) {
      indexClause(fn, cl, false);
    }
  }
}